

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobuf.c
# Opt level: O3

int abuf_strftime(autobuf *autobuf,char *format,tm *tm)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  
  if (autobuf == (autobuf *)0x0) {
    return 0;
  }
  sVar3 = strftime(autobuf->_buf + autobuf->_len,autobuf->_total - autobuf->_len,format,(tm *)tm);
  if (sVar3 == 0) {
    sVar1 = autobuf->_total;
    iVar2 = getpagesize();
    iVar2 = _autobuf_enlarge(autobuf,(long)iVar2 + sVar1);
    if (iVar2 < 0) {
      autobuf->_buf[autobuf->_len] = '\0';
    }
    else {
      sVar3 = strftime(autobuf->_buf + autobuf->_len,autobuf->_total - autobuf->_len,format,(tm *)tm
                      );
      if (sVar3 != 0) goto LAB_0010801d;
      autobuf->_buf[autobuf->_len] = '\0';
    }
    sVar3 = 0xffffffff;
  }
  else {
LAB_0010801d:
    autobuf->_len = autobuf->_len + sVar3;
  }
  return (int)sVar3;
}

Assistant:

int
abuf_strftime(struct autobuf *autobuf, const char *format, const struct tm *tm) {
  size_t rc;

  if (autobuf == NULL)
    return 0;

  rc = strftime(autobuf->_buf + autobuf->_len, autobuf->_total - autobuf->_len, format, tm);
  if (rc == 0) {
    /* we had an error! Probably the buffer too small. So we add some bytes. */
    if (_autobuf_enlarge(autobuf, autobuf->_total + getpagesize()) < 0) {
      autobuf->_buf[autobuf->_len] = '\0';
      return -1;
    }

    rc = strftime(autobuf->_buf + autobuf->_len, autobuf->_total - autobuf->_len, format, tm);
    if (rc == 0) {
      /* make sure we are null-terminated */
      autobuf->_buf[autobuf->_len] = 0;

      return -1;
    }
  }

  /* add data to length field */
  autobuf->_len += rc;
  return rc;
}